

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O0

void __thiscall CGameWorld::CGameWorld(CGameWorld *this)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  CWorldCore::CWorldCore
            ((CWorldCore *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined1 *)(in_RDI + 0x49) = 0;
  *(undefined1 *)(in_RDI + 0x48) = 0;
  for (iVar1 = 0; iVar1 < 5; iVar1 = iVar1 + 1) {
    *(undefined8 *)(in_RDI + 8 + (long)iVar1 * 8) = 0;
  }
  return;
}

Assistant:

CGameWorld::CGameWorld()
{
	m_pGameServer = 0x0;
	m_pConfig = 0x0;
	m_pServer = 0x0;

	m_Paused = false;
	m_ResetRequested = false;
	for(int i = 0; i < NUM_ENTTYPES; i++)
		m_apFirstEntityTypes[i] = 0;
}